

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall Minisat::Clause::calcAbstraction(Clause *this)

{
  ulong uVar1;
  int i;
  ulong uVar2;
  Clause CVar3;
  
  uVar1 = (ulong)((uint)this->header >> 5);
  CVar3.header = (anon_struct_4_5_613047fb_for_header)0x0;
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    CVar3.header = CVar3.header | 1 << (*(byte *)&this[uVar2 + 1].header >> 1 & 0x1f);
  }
  this[uVar1 + 1].header = CVar3.header;
  return;
}

Assistant:

void calcAbstraction() {
        assert(header.has_extra);
        uint32_t abstraction = 0;
        for (int i = 0; i < size(); i++)
            abstraction |= 1 << (var(data[i].lit) & 31);
        data[header.size].abs = abstraction;  }